

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDemo.c
# Opt level: O1

void RDL_demo_output(RDL_data *URFdata)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  RDL_cycle **cycleArray;
  RDL_edge *bondArray;
  char **otherCycleArray;
  RDL_node *atoms;
  long local_50;
  void *local_48;
  long local_40;
  void *local_38;
  
  uVar1 = RDL_getNofURF();
  puts("==========================================================URF=");
  printf("Number of Unique Ring Families: %d\n\n",(ulong)uVar1);
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      uVar2 = RDL_getWeightForURF(URFdata,uVar4);
      printf("URF %d has weight %d.\n",uVar4,(ulong)uVar2);
      uVar2 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar2;
    } while (uVar1 != uVar2);
  }
  puts("\n===============================================================");
  puts("The rest of this output might depend on the order of the input:\n");
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      uVar2 = RDL_getEdgesForURF(URFdata,uVar4,&local_48);
      printf("There are %d bonds in URF %d.\n",(ulong)uVar2,uVar4);
      free(local_48);
      uVar2 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar2;
    } while (uVar1 != uVar2);
  }
  putchar(10);
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      printf("Atoms in URF %d: ",uVar4);
      uVar2 = RDL_getNodesForURF(URFdata,uVar4,&local_38);
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          printf("%d ",(ulong)*(uint *)((long)local_38 + uVar6 * 4));
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      putchar(10);
      free(local_38);
      uVar2 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar2;
    } while (uVar2 != uVar1);
  }
  putchar(10);
  printf("A possible MCB (SSSR) ");
  uVar1 = RDL_getSSSR(URFdata,&local_50);
  printf("(%d rings):\n",(ulong)uVar1);
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      printf("ring %d: ",uVar4 & 0xffffffff);
      plVar3 = *(long **)(local_50 + uVar4 * 8);
      if ((int)plVar3[1] != 0) {
        uVar6 = 0;
        do {
          printf("(%d ",(ulong)*(uint *)(*plVar3 + uVar6 * 8));
          printf("%d), ",(ulong)*(uint *)(**(long **)(local_50 + uVar4 * 8) + 4 + uVar6 * 8));
          uVar6 = uVar6 + 1;
          plVar3 = *(long **)(local_50 + uVar4 * 8);
        } while (uVar6 < *(uint *)(plVar3 + 1));
      }
      putchar(10);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  RDL_deleteCycles(local_50,uVar1);
  putchar(10);
  printf("The RC Prototypes with bonds as pairs of atoms ");
  uVar1 = RDL_getRCPrototypes(URFdata,&local_50);
  printf("(%d rings):\n",(ulong)uVar1);
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      printf("ring %d: ",uVar4 & 0xffffffff);
      plVar3 = *(long **)(local_50 + uVar4 * 8);
      if ((int)plVar3[1] != 0) {
        uVar6 = 0;
        do {
          printf("(%d ",(ulong)*(uint *)(*plVar3 + uVar6 * 8));
          printf("%d), ",(ulong)*(uint *)(**(long **)(local_50 + uVar4 * 8) + 4 + uVar6 * 8));
          uVar6 = uVar6 + 1;
          plVar3 = *(long **)(local_50 + uVar4 * 8);
        } while (uVar6 < *(uint *)(plVar3 + 1));
      }
      putchar(10);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  putchar(10);
  printf("The RC Prototypes as vectors ");
  uVar1 = RDL_translateCycArray(URFdata,local_50,uVar1,&local_40);
  printf("(%d rings):\n",(ulong)uVar1);
  uVar2 = RDL_getEdgeArray(URFdata,&local_48);
  printf("Edge from");
  uVar4 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      printf("%2d",(ulong)*(uint *)((long)local_48 + uVar6 * 8));
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  printf("\n     to  ");
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      printf("%2d",(ulong)*(uint *)((long)local_48 + uVar6 * 8 + 4));
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  putchar(10);
  free(local_48);
  if (uVar1 != 0) {
    uVar6 = 0;
    do {
      printf("ring %3d: ",uVar6 & 0xffffffff);
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          printf("%d ",(ulong)(uint)(int)*(char *)(*(long *)(local_40 + uVar6 * 8) + uVar5));
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      putchar(10);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  RDL_deleteCycles(local_50,uVar1);
  RDL_deleteEdgeIdxArray(local_40,uVar1);
  puts("==========================================================URF=");
  return;
}

Assistant:

void RDL_demo_output(RDL_data* URFdata)
{
  unsigned URFcount, idx, count, obIdx, edgeCount;
  RDL_edge *bondArray;
  RDL_node *atoms;
  RDL_cycle **cycleArray;
  char **otherCycleArray;

  /* some output */
  URFcount = RDL_getNofURF(URFdata);
  printf("==========================================================URF=\n");
  printf("Number of Unique Ring Families: %d\n\n", URFcount);
  for(idx=0; idx<URFcount; ++idx)
  {
    printf("URF %d has weight %d.\n", idx, RDL_getWeightForURF(URFdata, idx));
  }
  /* some more output which might change when the order of the input is changed*/
  printf("\n===============================================================\n");
  printf("The rest of this output might depend on the order of the input:\n\n");
  for(idx=0; idx<URFcount; ++idx)
  {
      count = RDL_getEdgesForURF(URFdata, idx, &bondArray);
      printf("There are %d bonds in URF %d.\n", count, idx);
      free(bondArray);
  }
  printf("\n");

  for(idx=0; idx<URFcount; ++idx)
  {
      printf("Atoms in URF %d: ",idx);
      count = RDL_getNodesForURF(URFdata, idx, &atoms);
      for(obIdx=0; obIdx<count; ++obIdx)
      {
          printf("%d ",atoms[obIdx]);
      }
      printf("\n");
      free(atoms);
  }
  printf("\n");

  printf("A possible MCB (SSSR) ");
  count = RDL_getSSSR(URFdata, &cycleArray);
  printf("(%d rings):\n",count);
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %d: ",idx);
      for(obIdx=0; obIdx<cycleArray[idx]->weight;  ++obIdx)
      {
          printf("(%d ",cycleArray[idx]->edges[obIdx][0]);
          printf("%d), ",cycleArray[idx]->edges[obIdx][1]);
      }
      printf("\n");
  }
  RDL_deleteCycles(cycleArray, count);
  printf("\n");

  printf("The RC Prototypes with bonds as pairs of atoms ");
  count = RDL_getRCPrototypes(URFdata, &cycleArray);
  printf("(%d rings):\n",count);
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %d: ",idx);
      for(obIdx=0; obIdx<cycleArray[idx]->weight; ++obIdx)
      {
          printf("(%d ",cycleArray[idx]->edges[obIdx][0]);
          printf("%d), ",cycleArray[idx]->edges[obIdx][1]);
      }
      printf("\n");
  }
  printf("\n");

  printf("The RC Prototypes as vectors ");
  count = RDL_translateCycArray(URFdata, cycleArray, count, &otherCycleArray);
  printf("(%d rings):\n",count);
  /* To be able to understand the bitsets better: */
  edgeCount = RDL_getEdgeArray(URFdata, &bondArray);
  printf("Edge from");
  for(idx=0; idx<edgeCount; ++idx)
  {
      printf("%2d",bondArray[idx][0]);
  }
  printf("\n     to  ");
  for(idx=0; idx<edgeCount; ++idx)
  {
      printf("%2d",bondArray[idx][1]);
  }
  printf("\n");
  free(bondArray);
  /* the bitsets: */
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %3d: ",idx);
      for(obIdx=0; obIdx<edgeCount; ++obIdx)
      {
          printf("%d ",otherCycleArray[idx][obIdx]);
      }
      printf("\n");
  }
  RDL_deleteCycles(cycleArray, count);
  RDL_deleteEdgeIdxArray(otherCycleArray, count);
  printf("==========================================================URF=\n");
}